

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

range_t * __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::range_unsafe(range_t *__return_storage_ptr__,
              flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *this,const_iterator *it)

{
  long *plVar1;
  long lVar2;
  memory_resource *in_RAX;
  size_t sVar3;
  size_t sVar4;
  polymorphic_allocator<char> local_28;
  
  plVar1 = (long *)it->p_;
  lVar2 = plVar1[2];
  (__return_storage_ptr__->super_range).buffer_begin = 0;
  (__return_storage_ptr__->super_range).data_end = 0;
  (__return_storage_ptr__->super_range).buffer_end = 0;
  sVar3 = (long)plVar1 - (long)(this->buffer_).v2_.begin;
  (__return_storage_ptr__->super_range).buffer_begin = sVar3;
  sVar4 = lVar2 + sVar3 + 0x18;
  (__return_storage_ptr__->super_range).data_end = sVar4;
  if (*plVar1 == 0) {
    local_28._M_resource = in_RAX;
    last((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          *)&local_28);
    if (local_28._M_resource != (memory_resource *)it->p_) {
      std::terminate();
    }
  }
  else {
    sVar4 = *plVar1 + sVar3;
  }
  (__return_storage_ptr__->super_range).buffer_end = sVar4;
  return __return_storage_ptr__;
}

Assistant:

range_t range_unsafe(const_iterator const &it) const noexcept {
        size_with_padding_t const s{ traits_traits::get_size(it.get_ptr()) };
        range_t r{};
        r.buffer_begin = it.get_ptr() - buff().begin;
        r.data_end = r.begin() + s.size;
        if constexpr (traits_traits::has_next_offset_v) {
            size_type const next_offset = traits_traits::get_next_offset(it.get_ptr());
            if (0 == next_offset) {
                FFL_CODDING_ERROR_IF(last() != it);
                r.buffer_end = r.begin() + s.size;
            } else {
                r.buffer_end = r.begin() + next_offset;
            }
        } else {
            if (last() == it) {
                r.buffer_end = r.begin() + s.size;
            } else {
                r.buffer_end = r.begin() + s.size_padded();
            }
        }
        return r;
    }